

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::HEARTGenerator::getOrAddProcessorInstance
          (HEARTGenerator *this,pool_ptr<soul::AST::ProcessorInstance> *instance)

{
  UnqualifiedName *this_00;
  SharedEndpoint *pSVar1;
  ProcessorInstance *pPVar2;
  long lVar3;
  _Alloc_hider __s1;
  size_type __n;
  int iVar4;
  _Storage<unsigned_int,_true> _Var5;
  ProcessorBase *pPVar6;
  ProcessorInstance *pPVar7;
  optional<unsigned_int> oVar8;
  long *in_RDX;
  SharedEndpoint *pSVar9;
  ProcessorInstance *pPVar10;
  SourceCodeText *pSVar11;
  SourceCodeText *pSVar12;
  bool bVar13;
  string instanceName;
  pool_ptr<soul::AST::Constant> c;
  string local_148;
  undefined1 local_128 [24];
  undefined1 local_110 [80];
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  if (*in_RDX == 0) {
    (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)0x0;
  }
  else {
    this_00 = *(UnqualifiedName **)(*in_RDX + 0x28);
    if (this_00 == (UnqualifiedName *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    AST::UnqualifiedName::toString_abi_cxx11_(&local_148,this_00);
    __n = local_148._M_string_length;
    __s1._M_p = local_148._M_dataplus._M_p;
    pSVar1 = (SharedEndpoint *)instance[3].object[2].super_ASTObject._vptr_ASTObject;
    for (pSVar9 = instance[3].object[1].implicitInstanceSource.object; pSVar9 != pSVar1;
        pSVar9 = pSVar9 + 1) {
      pPVar7 = (ProcessorInstance *)(pSVar9->endpoint).object;
      if ((__n == (pPVar7->instanceName)._M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp(__s1._M_p,(pPVar7->instanceName)._M_dataplus._M_p,__n), iVar4 == 0))))
      goto LAB_0024aa32;
    }
    pPVar2 = instance[1].object;
    if (pPVar2 == (ProcessorInstance *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    pSVar11 = pPVar2[3].super_ASTObject.context.location.sourceCode.object;
    pSVar12 = (SourceCodeText *)pPVar2[3].super_ASTObject.context.location.location.data;
    if (pSVar11 != pSVar12) {
      pPVar10 = (ProcessorInstance *)(this->super_ASTVisitor)._vptr_ASTVisitor;
      local_110._64_8_ = pSVar12;
      do {
        if (*(UnqualifiedName **)(*(long *)pSVar11 + 0x28) == (UnqualifiedName *)0x0) {
          (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        AST::UnqualifiedName::toString_abi_cxx11_
                  ((string *)local_128,*(UnqualifiedName **)(*(long *)pSVar11 + 0x28));
        if (local_128._8_8_ == local_148._M_string_length) {
          if (local_128._8_8_ == 0) {
            bVar13 = true;
          }
          else {
            iVar4 = bcmp((void *)local_128._0_8_,local_148._M_dataplus._M_p,local_128._8_8_);
            bVar13 = iVar4 == 0;
          }
        }
        else {
          bVar13 = false;
        }
        if ((ProcessorInstance *)local_128._0_8_ != (ProcessorInstance *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        pPVar7 = pPVar10;
        if (bVar13) {
          if (instance[1].object == (ProcessorInstance *)0x0) {
            (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          pPVar6 = AST::Scope::findSingleMatchingProcessor
                             ((Scope *)&(instance[1].object)->instanceName,
                              *(ProcessorInstance **)pSVar11);
          local_128._0_8_ = (SourceCodeText *)0x0;
          local_128._8_8_ = 0;
          pPVar7 = PoolAllocator::allocate<soul::heart::ProcessorInstance,soul::CodeLocation>
                             (*(PoolAllocator **)&instance[3].object[3].super_ASTObject.objectType,
                              (CodeLocation *)local_128);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_128._0_8_);
          std::__cxx11::string::_M_assign((string *)&pPVar7->instanceName);
          (*(pPVar6->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xd])
                    ((string *)local_128,pPVar6);
          IdentifierPath::toString_abi_cxx11_(&local_c0,(IdentifierPath *)local_128);
          pSVar12 = (SourceCodeText *)local_110._64_8_;
          std::__cxx11::string::operator=((string *)&pPVar7->sourceName,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          local_128._8_8_ = 0;
          if (8 < (ulong)local_128._16_8_) {
            if ((SourceCodeText *)local_128._0_8_ != (SourceCodeText *)0x0) {
              operator_delete__((void *)local_128._0_8_);
            }
            local_128._0_8_ = local_110;
            local_128._16_8_ = 8;
          }
          local_110._72_8_ = *(undefined8 *)(*(long *)pSVar11 + 0x50);
          oVar8 = getProcessorArraySize((pool_ptr<soul::AST::Expression> *)(local_110 + 0x48));
          _Var5._M_value =
               oVar8.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          if (((ulong)oVar8.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
            _Var5._M_value = 1;
          }
          pPVar7->arraySize = (uint32_t)_Var5;
          if (*(long *)(*(long *)pSVar11 + 0x40) != 0) {
            if (*(long **)(*(long *)pSVar11 + 0x40) == (long *)0x0) {
              (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            (**(code **)(**(long **)(*(long *)pSVar11 + 0x40) + 0x68))((string *)local_128);
            if ((SourceCodeText *)local_128._0_8_ == (SourceCodeText *)0x0) {
              (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
              lVar3 = *(long *)(*(long *)pSVar11 + 0x40);
              if (lVar3 != 0) {
                CompileMessageHelpers::createMessage<>
                          (&local_68,syntax,error,"Clock ratio must be an integer constant");
                AST::Context::throwError((Context *)(lVar3 + 0x10),&local_68,false);
              }
LAB_0024aaff:
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            if (*(long *)(*(long *)pSVar11 + 0x40) == 0) {
              (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
              goto LAB_0024aaff;
            }
            heart::ClockMultiplier::setMultiplier<soul::AST::Context&>
                      (&pPVar7->clockMultiplier,
                       (Context *)(*(long *)(*(long *)pSVar11 + 0x40) + 0x10),
                       (Value *)(local_128._0_8_ + 0x30));
          }
          if (*(long *)(*(long *)pSVar11 + 0x48) != 0) {
            if (*(long **)(*(long *)pSVar11 + 0x48) == (long *)0x0) {
              (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            (**(code **)(**(long **)(*(long *)pSVar11 + 0x48) + 0x68))((string *)local_128);
            if ((SourceCodeText *)local_128._0_8_ == (SourceCodeText *)0x0) {
              (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
              lVar3 = *(long *)(*(long *)pSVar11 + 0x48);
              if (lVar3 != 0) {
                CompileMessageHelpers::createMessage<>
                          (&local_a0,syntax,error,"Clock ratio must be an integer constant");
                AST::Context::throwError((Context *)(lVar3 + 0x10),&local_a0,false);
              }
LAB_0024ab62:
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            if (*(long *)(*(long *)pSVar11 + 0x48) == 0) {
              (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
              goto LAB_0024ab62;
            }
            heart::ClockMultiplier::setDivider<soul::AST::Context&>
                      (&pPVar7->clockMultiplier,
                       (Context *)(*(long *)(*(long *)pSVar11 + 0x48) + 0x10),
                       (Value *)(local_128._0_8_ + 0x30));
          }
          if (*(long *)(*(long *)pSVar11 + 0x38) != 0) {
            (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar10;
            throwInternalCompilerError
                      ("i->specialisationArgs == nullptr","getOrAddProcessorInstance",0x14f);
          }
          local_128._0_8_ = pPVar7;
          std::
          vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
          ::emplace_back<soul::pool_ref<soul::heart::ProcessorInstance>>
                    ((vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
                      *)&instance[3].object[1].implicitInstanceSource,
                     (pool_ref<soul::heart::ProcessorInstance> *)local_128);
          if (bVar13) goto LAB_0024aa32;
        }
        pSVar11 = (SourceCodeText *)&pSVar11->filename;
        pPVar10 = pPVar7;
      } while (pSVar11 != pSVar12);
    }
    pPVar7 = (ProcessorInstance *)0x0;
LAB_0024aa32:
    (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<heart::ProcessorInstance> getOrAddProcessorInstance (pool_ptr<AST::ProcessorInstance> instance)
    {
        if (instance == nullptr)
            return {};

        auto instanceName = instance->instanceName->toString();

        for (auto i : module.processorInstances)
            if (instanceName == i->instanceName)
                return i;

        for (auto& i : sourceGraph->processorInstances)
        {
            if (i->instanceName->toString() == instanceName)
            {
                auto& targetProcessor = sourceGraph->findSingleMatchingProcessor (i);

                auto& p = module.allocate<heart::ProcessorInstance> (CodeLocation{});
                p.instanceName = instanceName;
                p.sourceName = targetProcessor.getFullyQualifiedPath().toString();
                p.arraySize = getProcessorArraySize (i->arraySize).value_or (1);

                if (i->clockMultiplierRatio != nullptr)
                {
                    if (auto c = i->clockMultiplierRatio->getAsConstant())
                        p.clockMultiplier.setMultiplier (i->clockMultiplierRatio->context, c->value);
                    else
                        i->clockMultiplierRatio->context.throwError (Errors::ratioMustBeInteger());
                }

                if (i->clockDividerRatio != nullptr)
                {
                    if (auto c = i->clockDividerRatio->getAsConstant())
                        p.clockMultiplier.setDivider (i->clockDividerRatio->context, c->value);
                    else
                        i->clockDividerRatio->context.throwError (Errors::ratioMustBeInteger());
                }

                SOUL_ASSERT (i->specialisationArgs == nullptr);

                module.processorInstances.push_back (p);
                return p;
            }
        }

        return {};
    }